

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

Pseudo * linearize_symbol_expression(Proc *proc,AstNode *expr)

{
  LuaSymbol *sym_00;
  Constant *constant_00;
  Pseudo *key_pseudo;
  Pseudo *container_pseudo;
  Pseudo *operand_env;
  Pseudo *operand_varname;
  Constant *constant;
  LuaSymbol *sym;
  AstNode *expr_local;
  Proc *proc_local;
  
  sym_00 = (expr->field_2).symbol_expr.var;
  if (sym_00->symbol_type == SYM_GLOBAL) {
    if ((sym_00->field_1).variable.env == (LuaSymbol *)0x0) {
      __assert_fail("sym->variable.env",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x4f8,"Pseudo *linearize_symbol_expression(Proc *, AstNode *)");
    }
    constant_00 = allocate_string_constant(proc,(sym_00->field_1).variable.var_name);
    key_pseudo = allocate_constant_pseudo(proc,constant_00);
    container_pseudo = allocate_symbol_pseudo(proc,(sym_00->field_1).variable.env,0);
    proc_local = (Proc *)create_global_indexed_pseudo
                                   (proc,container_pseudo,key_pseudo,expr->line_number);
  }
  else if (sym_00->symbol_type == SYM_LOCAL) {
    proc_local = (Proc *)(sym_00->field_1).variable.pseudo;
  }
  else if (sym_00->symbol_type == SYM_UPVALUE) {
    proc_local = (Proc *)allocate_symbol_pseudo
                                   (proc,sym_00,*(uint *)((long)&sym_00->field_1 + 0x20) & 0xffff);
  }
  else {
    handle_error(proc->linearizer->compiler_state,"feature not yet implemented");
    proc_local = (Proc *)0x0;
  }
  return (Pseudo *)proc_local;
}

Assistant:

static Pseudo *linearize_symbol_expression(Proc *proc, AstNode *expr)
{
	LuaSymbol *sym = expr->symbol_expr.var;
	if (sym->symbol_type == SYM_GLOBAL) {
		assert(sym->variable.env);
		const Constant *constant = allocate_string_constant(proc, sym->variable.var_name);
		Pseudo *operand_varname = allocate_constant_pseudo(proc, constant);
		Pseudo* operand_env = allocate_symbol_pseudo(proc, sym->variable.env, 0); // no register
		return create_global_indexed_pseudo(proc, operand_env, operand_varname, expr->line_number);
	} else if (sym->symbol_type == SYM_LOCAL) {
		return sym->variable.pseudo;
	} else if (sym->symbol_type == SYM_UPVALUE) {
		/* upvalue index is the position of upvalue in the function, we treat this as the pseudo register for
		 * the upvalue */
		return allocate_symbol_pseudo(proc, sym, sym->upvalue.upvalue_index);
	} else {
		handle_error(proc->linearizer->compiler_state, "feature not yet implemented");
		return NULL;
	}
}